

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O0

void CMdlclose(void *vdlh)

{
  void *in_RDI;
  dlhandle dlh;
  
  free(*(void **)((long)in_RDI + 8));
  free(in_RDI);
  return;
}

Assistant:

void
CMdlclose(void *vdlh)
{
#if NO_DYNAMIC_LINKING
    return;
#else
    dlhandle dlh = (dlhandle)vdlh;
#ifdef ACTUALL_DO_DLCLOSE
    dlclose(dlh->dlopen_handle);
#endif
    free(dlh->lib_prefix);
    free(dlh);
#endif
}